

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.cpp
# Opt level: O3

ostream * subsat::operator<<(ostream *os,Constraint *c)

{
  uint uVar1;
  Lit lit;
  bool bVar2;
  long lVar3;
  Constraint *__range1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"{ ",2);
  uVar1 = c->m_size;
  if ((ulong)uVar1 != 0) {
    bVar2 = true;
    lVar3 = 0;
    do {
      lit.m_index = *(index_type *)((long)&c->m_literals[0].m_index + lVar3);
      if (!bVar2) {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      }
      operator<<(os,lit);
      lVar3 = lVar3 + 4;
      bVar2 = false;
    } while ((ulong)uVar1 << 2 != lVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," }",2);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, Constraint const& c)
{
  os << "{ ";
  bool first = true;
  for (Lit lit : c) {
    if (first) {
      first = false;
    } else {
      os << ", ";
    }
    os << lit;
  }
  os << " }";
  return os;
}